

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

pool_ptr<soul::AST::ProcessorInstance> __thiscall
soul::AST::Graph::findChildProcessor<soul::Identifier>
          (Graph *this,Identifier *processorInstanceName)

{
  string *psVar1;
  UnqualifiedName *pUVar2;
  long *in_RDX;
  string *psVar3;
  _func_int **pp_Var4;
  
  psVar3 = processorInstanceName[0x26].name;
  psVar1 = processorInstanceName[0x27].name;
  pp_Var4 = (_func_int **)0x0;
  do {
    if (psVar3 == psVar1) {
LAB_0021694f:
      (this->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject = pp_Var4;
      return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
    }
    pUVar2 = pool_ptr<soul::AST::UnqualifiedName>::operator->
                       ((pool_ptr<soul::AST::UnqualifiedName> *)((psVar3->_M_dataplus)._M_p + 0x28))
    ;
    if ((pUVar2->identifier).name == (string *)*in_RDX) {
      pp_Var4 = (_func_int **)(psVar3->_M_dataplus)._M_p;
      goto LAB_0021694f;
    }
    psVar3 = (string *)&psVar3->_M_string_length;
  } while( true );
}

Assistant:

pool_ptr<ProcessorInstance> findChildProcessor (const StringType& processorInstanceName) const
        {
            for (auto& i : processorInstances)
                if (i->instanceName->identifier == processorInstanceName)
                    return i;

            return {};
        }